

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

void plutovg_canvas_clip_extents(plutovg_canvas_t *canvas,plutovg_rect_t *extents)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (canvas->state->clipping == true) {
    plutovg_span_buffer_extents(&canvas->state->clip_spans,extents);
    return;
  }
  fVar1 = (canvas->clip_rect).y;
  fVar2 = (canvas->clip_rect).w;
  fVar3 = (canvas->clip_rect).h;
  extents->x = (canvas->clip_rect).x;
  extents->y = fVar1;
  extents->w = fVar2;
  extents->h = fVar3;
  return;
}

Assistant:

void plutovg_canvas_clip_extents(const plutovg_canvas_t* canvas, plutovg_rect_t* extents)
{
    if(canvas->state->clipping) {
        plutovg_span_buffer_extents(&canvas->state->clip_spans, extents);
    } else {
        extents->x = canvas->clip_rect.x;
        extents->y = canvas->clip_rect.y;
        extents->w = canvas->clip_rect.w;
        extents->h = canvas->clip_rect.h;
    }
}